

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cpp
# Opt level: O2

bool __thiscall CHIP8::loadROM(CHIP8 *this,string *filename)

{
  char cVar1;
  uint uVar2;
  ostream *poVar3;
  void *pvVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  ifstream in;
  
  std::ifstream::ifstream(&in);
  poVar3 = std::operator<<((ostream *)&std::cerr,"Loading program: ");
  poVar3 = std::operator<<(poVar3,(string *)filename);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::ifstream::open((string *)&in,(_Ios_Openmode)filename);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Program couldn\'t be opened!");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  else {
    std::istream::seekg((long)&in,_S_beg);
    uVar2 = std::istream::tellg();
    std::istream::seekg((long)&in,_S_beg);
    poVar3 = std::operator<<((ostream *)&std::cerr,"\nProgram loaded : ");
    poVar3 = std::operator<<(poVar3,(string *)filename);
    poVar3 = std::operator<<(poVar3,"\nSize(bytes)    : ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar2);
    poVar3 = std::operator<<(poVar3,"\n");
    std::endl<char,std::char_traits<char>>(poVar3);
    pvVar4 = operator_new__((long)(int)uVar2);
    std::istream::read((char *)&in,(long)pvVar4);
    if ((int)uVar2 < 0xe00) {
      uVar5 = 0;
      uVar6 = 0;
      if (0 < (int)uVar2) {
        uVar6 = (ulong)uVar2;
      }
      for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
        this->memory[uVar5 + 0x200] = *(uchar *)((long)pvVar4 + uVar5);
      }
      operator_delete__(pvVar4);
      bVar7 = true;
      std::ifstream::close();
      goto LAB_00102b55;
    }
    poVar3 = std::operator<<((ostream *)&std::cerr,"Program too big to fit in memory!");
    std::endl<char,std::char_traits<char>>(poVar3);
    std::ifstream::close();
  }
  bVar7 = false;
LAB_00102b55:
  std::ifstream::~ifstream(&in);
  return bVar7;
}

Assistant:

bool CHIP8::loadROM(const std::string &filename){
    std::ifstream in;
    std::cerr << "Loading program: " << filename << std::endl;
    in.open(filename, std::ios::in | std::ios::binary);

    if(!in.is_open()){
        std::cerr << "Program couldn't be opened!" << std::endl;
        return false;
    }

    // get length of file:
    in.seekg (0, in.end);
    int length = in.tellg();
    in.seekg (0, in.beg);

    std::cerr << "\nProgram loaded : " << filename
              << "\nSize(bytes)    : " << length
              << "\n" << std::endl;

    char *buffer = new char[length];

    in.read(buffer, length);

    if (length < 4096 - 512){
        for (int i = 0; i < length; ++i){
            memory[512 + i] = buffer[i];
        }
    }
    else{
        std::cerr << "Program too big to fit in memory!" << std::endl;
        in.close();
        return false;
    }

    delete[] buffer;
    in.close();
    return true;
}